

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

void __thiscall
CBucket::insert(CBucket *this,AbstractSearchState *AbstractSearchState1,int priority)

{
  vector<AbstractSearchState*,std::allocator<AbstractSearchState*>> *this_00;
  iterator __position;
  iterator __position_00;
  int iVar1;
  int startbucketindex;
  int local_24;
  AbstractSearchState *local_20;
  
  if (priority == 1000000000) {
    startbucketindex = this->numofbuckets + -1;
  }
  else {
    iVar1 = priority - this->firstpriority;
    startbucketindex = this->numofbuckets + -2;
    if (iVar1 < startbucketindex) {
      startbucketindex = iVar1;
    }
  }
  this_00 = (vector<AbstractSearchState*,std::allocator<AbstractSearchState*>> *)
            (this->bucketV + startbucketindex);
  __position._M_current = *(AbstractSearchState ***)(this_00 + 8);
  local_24 = priority;
  local_20 = AbstractSearchState1;
  if (__position._M_current == *(AbstractSearchState ***)(this_00 + 0x10)) {
    std::vector<AbstractSearchState*,std::allocator<AbstractSearchState*>>::
    _M_realloc_insert<AbstractSearchState*const&>(this_00,__position,&local_20);
  }
  else {
    *__position._M_current = AbstractSearchState1;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  local_20->heapindex =
       (int)((ulong)((long)this->bucketV[startbucketindex].
                           super__Vector_base<AbstractSearchState_*,_std::allocator<AbstractSearchState_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)this->bucketV[startbucketindex].
                          super__Vector_base<AbstractSearchState_*,_std::allocator<AbstractSearchState_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  if (startbucketindex == this->numofbuckets + -2) {
    __position_00._M_current =
         (this->assortedpriorityV).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->assortedpriorityV).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->assortedpriorityV,__position_00,&local_24
                );
    }
    else {
      *__position_00._M_current = local_24;
      (this->assortedpriorityV).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position_00._M_current + 1;
    }
    iVar1 = (int)((ulong)((long)(this->assortedpriorityV).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->assortedpriorityV).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
    if (this->maxassortedpriorityVsize < iVar1) {
      this->maxassortedpriorityVsize = iVar1;
    }
  }
  if (local_24 < this->currentminelement_priority || this->currentminelement_priority == 1000000000)
  {
    recomputeminelementupfrombucket(this,startbucketindex);
  }
  return;
}

Assistant:

void insert(AbstractSearchState *AbstractSearchState1, int priority)
    {
        //compute bucket index
        int bucketindex = priority - firstpriority;
        if (priority == INFINITECOST) {
            bucketindex = numofbuckets - 1;
        }
        else if (bucketindex >= numofbuckets - 2) {
            bucketindex = numofbuckets - 2; //overflow bucket
        }

        //insert the element itself
        bucketV[bucketindex].push_back(AbstractSearchState1);
        AbstractSearchState1->heapindex = (int)bucketV[bucketindex].size() - 1;

        if (bucketindex == numofbuckets - 2) {
            assortedpriorityV.push_back(priority);

            if (maxassortedpriorityVsize < (int)assortedpriorityV.size()) maxassortedpriorityVsize
                = (int)assortedpriorityV.size();
        }

        //re-compute minelement if necessary
        if (priority < currentminelement_priority || currentminelement_priority == INFINITECOST) {
            recomputeminelementupfrombucket(bucketindex);
        }
    }